

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::InstrumentPass::GenUintCastCode
          (InstrumentPass *this,uint32_t val_id,InstructionBuilder *builder)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  IRContext *this_00;
  TypeManager *this_01;
  DefUseManager *this_02;
  Instruction *pIVar4;
  Type *pTVar5;
  undefined4 extraout_var;
  Integer *val_ty;
  uint32_t val_ty_id;
  TypeManager *type_mgr;
  uint32_t val_32b_id;
  InstructionBuilder *builder_local;
  uint32_t val_id_local;
  InstrumentPass *this_local;
  
  this_local._4_4_ = Gen32BitCvtCode(this,val_id,builder);
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_type_mgr(this_00);
  this_02 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar4 = analysis::DefUseManager::GetDef(this_02,this_local._4_4_);
  uVar2 = Instruction::type_id(pIVar4);
  pTVar5 = analysis::TypeManager::GetType(this_01,uVar2);
  iVar3 = (*pTVar5->_vptr_Type[9])();
  bVar1 = analysis::Integer::IsSigned((Integer *)CONCAT44(extraout_var,iVar3));
  if (bVar1) {
    uVar2 = GetUintId(this);
    pIVar4 = InstructionBuilder::AddUnaryOp(builder,uVar2,OpBitcast,this_local._4_4_);
    this_local._4_4_ = Instruction::result_id(pIVar4);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t InstrumentPass::GenUintCastCode(uint32_t val_id,
                                         InstructionBuilder* builder) {
  // Convert value to 32-bit if necessary
  uint32_t val_32b_id = Gen32BitCvtCode(val_id, builder);
  // Cast value to unsigned if necessary
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  uint32_t val_ty_id = get_def_use_mgr()->GetDef(val_32b_id)->type_id();
  analysis::Integer* val_ty = type_mgr->GetType(val_ty_id)->AsInteger();
  if (!val_ty->IsSigned()) return val_32b_id;
  return builder->AddUnaryOp(GetUintId(), spv::Op::OpBitcast, val_32b_id)
      ->result_id();
}